

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

XMLElement * CS248::Collada::ColladaParser::get_technique_cmu462(XMLElement *xml)

{
  bool bVar1;
  XMLElement *pXVar2;
  char *pcVar3;
  string profile;
  XMLElement *technique;
  string *in_stack_000001a8;
  XMLElement *in_stack_000001b0;
  char *in_stack_ffffffffffffff48;
  XMLElement *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  XMLElement *local_18;
  XMLElement *local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"extra/technique",&local_39);
  pXVar2 = get_element(in_stack_000001b0,in_stack_000001a8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pXVar2;
  do {
    if (local_18 == (XMLElement *)0x0) {
      return (XMLElement *)0x0;
    }
    pcVar3 = tinyxml2::XMLElement::Attribute
                       ((XMLElement *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                        (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar3,&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff5f = bVar1;
    if (bVar1) {
      local_8 = local_18;
    }
    else {
      in_stack_ffffffffffffff50 =
           tinyxml2::XMLNode::NextSiblingElement
                     (&in_stack_ffffffffffffff50->super_XMLNode,in_stack_ffffffffffffff48);
      local_18 = in_stack_ffffffffffffff50;
    }
    std::__cxx11::string::~string(local_70);
  } while (!bVar1);
  return local_8;
}

Assistant:

XMLElement* ColladaParser::get_technique_cmu462(XMLElement* xml) {
  XMLElement* technique = get_element(xml, "extra/technique");
  while (technique) {
    string profile = technique->Attribute("profile");
    if (profile == "CS248") return technique;
    technique = technique->NextSiblingElement("technique");
  }

  return NULL;
}